

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_ThreeQuads_Test::~TEST_DoublingFactorCounterTest_ThreeQuads_Test
          (TEST_DoublingFactorCounterTest_ThreeQuads_Test *this)

{
  TEST_DoublingFactorCounterTest_ThreeQuads_Test *mem;
  TEST_DoublingFactorCounterTest_ThreeQuads_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_ThreeQuads_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeQuads)
{
	addPair(Tile::WestWind);
	addQuad(Tile::ThreeOfCharacters, false);
	addQuad(Tile::FourOfCircles, true);
	addQuad(Tile::FiveOfBamboos, true);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeQuads));
	CHECK_EQUAL(2, r.doubling_factor);
}